

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateCancelRequest(void)

{
  ImGuiID id;
  ImGuiWindow *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiPopupData *pIVar3;
  ImRect local_40;
  undefined1 local_30 [8];
  ImRect child_rect;
  ImGuiWindow *parent_window;
  ImGuiWindow *child_window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  bVar2 = IsNavInputTest(1,ImGuiNavReadMode_Pressed);
  if (bVar2) {
    if ((pIVar1->DebugLogFlags & 8U) != 0) {
      DebugLog("[nav] ImGuiNavInput_Cancel\n");
    }
    if (pIVar1->ActiveId == 0) {
      if (pIVar1->NavLayer == ImGuiNavLayer_Main) {
        if ((((pIVar1->NavWindow == (ImGuiWindow *)0x0) ||
             (pIVar1->NavWindow == pIVar1->NavWindow->RootWindow)) ||
            ((pIVar1->NavWindow->Flags & 0x4000000U) != 0)) ||
           (pIVar1->NavWindow->ParentWindow == (ImGuiWindow *)0x0)) {
          if (((pIVar1->OpenPopupStack).Size < 1) ||
             (pIVar3 = ImVector<ImGuiPopupData>::back(&pIVar1->OpenPopupStack),
             (pIVar3->Window->Flags & 0x8000000U) != 0)) {
            if ((pIVar1->NavWindow != (ImGuiWindow *)0x0) &&
               (((pIVar1->NavWindow->Flags & 0x4000000U) != 0 ||
                ((pIVar1->NavWindow->Flags & 0x1000000U) == 0)))) {
              pIVar1->NavWindow->NavLastIds[0] = 0;
            }
            pIVar1->NavFocusScopeId = 0;
            pIVar1->NavId = 0;
          }
          else {
            ClosePopupToLevel((pIVar1->OpenPopupStack).Size + -1,true);
          }
        }
        else {
          this = pIVar1->NavWindow;
          child_rect.Max = (ImVec2)pIVar1->NavWindow->ParentWindow;
          if (this->ChildId == 0) {
            __assert_fail("child_window->ChildId != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui.cpp"
                          ,0x2984,"void ImGui::NavUpdateCancelRequest()");
          }
          _local_30 = ImGuiWindow::Rect(this);
          FocusWindow((ImGuiWindow *)child_rect.Max);
          id = this->ChildId;
          local_40 = WindowRectAbsToRel((ImGuiWindow *)child_rect.Max,(ImRect *)local_30);
          SetNavID(id,ImGuiNavLayer_Main,0,&local_40);
          NavRestoreHighlightAfterMove();
        }
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
        NavRestoreHighlightAfterMove();
      }
    }
    else {
      bVar2 = IsActiveIdUsingNavInput(1);
      if (!bVar2) {
        ClearActiveID();
      }
    }
  }
  return;
}

Assistant:

static void ImGui::NavUpdateCancelRequest()
{
    ImGuiContext& g = *GImGui;
    if (!IsNavInputTest(ImGuiNavInput_Cancel, ImGuiNavReadMode_Pressed))
        return;

    IMGUI_DEBUG_LOG_NAV("[nav] ImGuiNavInput_Cancel\n");
    if (g.ActiveId != 0)
    {
        if (!IsActiveIdUsingNavInput(ImGuiNavInput_Cancel))
            ClearActiveID();
    }
    else if (g.NavLayer != ImGuiNavLayer_Main)
    {
        // Leave the "menu" layer
        NavRestoreLayer(ImGuiNavLayer_Main);
        NavRestoreHighlightAfterMove();
    }
    else if (g.NavWindow && g.NavWindow != g.NavWindow->RootWindow && !(g.NavWindow->Flags & ImGuiWindowFlags_Popup) && g.NavWindow->ParentWindow)
    {
        // Exit child window
        ImGuiWindow* child_window = g.NavWindow;
        ImGuiWindow* parent_window = g.NavWindow->ParentWindow;
        IM_ASSERT(child_window->ChildId != 0);
        ImRect child_rect = child_window->Rect();
        FocusWindow(parent_window);
        SetNavID(child_window->ChildId, ImGuiNavLayer_Main, 0, WindowRectAbsToRel(parent_window, child_rect));
        NavRestoreHighlightAfterMove();
    }
    else if (g.OpenPopupStack.Size > 0 && !(g.OpenPopupStack.back().Window->Flags & ImGuiWindowFlags_Modal))
    {
        // Close open popup/menu
        ClosePopupToLevel(g.OpenPopupStack.Size - 1, true);
    }
    else
    {
        // Clear NavLastId for popups but keep it for regular child window so we can leave one and come back where we were
        if (g.NavWindow && ((g.NavWindow->Flags & ImGuiWindowFlags_Popup) || !(g.NavWindow->Flags & ImGuiWindowFlags_ChildWindow)))
            g.NavWindow->NavLastIds[0] = 0;
        g.NavId = g.NavFocusScopeId = 0;
    }
}